

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O3

void __thiscall
Qentem::HArray<Qentem::String<char>,_Qentem::Value<char>_>::Insert
          (HArray<Qentem::String<char>,_Qentem::Value<char>_> *this,String<char> *key,
          Value<char> *value)

{
  char *pcVar1;
  Value<char> *this_00;
  Char_T *key_00;
  SizeT *pSVar2;
  long lVar3;
  int iVar4;
  SizeT *in_RAX;
  HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *pHVar5;
  SizeT SVar6;
  uint uVar7;
  SizeT SVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  SizeT *index;
  SizeT *local_28;
  
  SVar8 = (this->
          super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
          ).index_;
  local_28 = in_RAX;
  if (SVar8 == (this->
               super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               ).capacity_) {
    HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
    resize(&this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ,(SVar8 + (SVar8 == 0)) * 2);
  }
  key_00 = key->storage_;
  uVar9 = (ulong)key->length_;
  if (uVar9 == 0) {
    SVar8 = 0x8000000b;
  }
  else {
    uVar7 = 0xb;
    iVar4 = 0;
    uVar11 = 0;
    iVar12 = 0x21;
    do {
      pcVar1 = key_00 + uVar11;
      iVar14 = iVar4 + iVar12;
      uVar10 = (uint)uVar11;
      iVar4 = iVar4 + 2;
      uVar13 = (uint)uVar9;
      uVar11 = uVar11 + 1;
      lVar3 = uVar9 - 1;
      uVar9 = uVar9 - 1;
      uVar7 = (int)key_00[lVar3] + (uVar13 ^ uVar10) * ((int)*pcVar1 * iVar12 * uVar10 + uVar7);
      iVar12 = iVar14;
    } while (uVar11 < uVar9);
    SVar8 = uVar7 | 0x80000000;
  }
  pHVar5 = HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
           ::find(&this->
                   super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                  ,&local_28,key_00,key->length_,SVar8);
  if (pHVar5 == (HAItem_T<Qentem::String<char>,_Qentem::Value<char>_> *)0x0) {
    uVar7 = (this->
            super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            ).capacity_;
    uVar10 = (this->
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ).index_;
    pSVar2 = (this->
             super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             ).hashTable_;
    SVar6 = uVar10 + 1;
    (this->
    super_HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
    ).index_ = SVar6;
    *local_28 = SVar6;
    this_00 = (Value<char> *)(pSVar2 + (ulong)uVar7 + (ulong)uVar10 * 0xc + 6);
    *(SizeT *)&this_00[-1].type_ = SVar8;
    *(undefined4 *)&this_00[-1].field_0x14 = 0;
    this_00[-1].field_0.array_.storage_ = (Value<char> *)key->storage_;
    this_00[-1].field_0.array_.index_ = key->length_;
    key->length_ = 0;
    key->storage_ = (char *)0x0;
    Value<char>::Value(this_00,value);
  }
  else {
    Value<char>::operator=(&pHVar5->Value,value);
  }
  return;
}

Assistant:

void Insert(Key_T &&key, Value_T &&value) {
        if (Size() == Capacity()) {
            expand();
        }

        const SizeT hash = StringUtils::Hash(key.First(), key.Length());
        SizeT      *index;
        HItem      *item = find(index, key.First(), key.Length(), hash);

        if (item == nullptr) {
            item = insert(index, Memory::Move(key), hash);
            Memory::Initialize(&(item->Value), Memory::Move(value));
        } else {
            item->Value = Memory::Move(value);
        }
    }